

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int FindSprite(char *sprname)

{
  int local_1c;
  DWORD nameint;
  int i;
  char *sprname_local;
  
  local_1c = 0;
  while( true ) {
    if (NumUnchangedSprites <= local_1c) {
      return -1;
    }
    if (*(int *)(UnchangedSpriteNames + (local_1c << 2)) == *(int *)sprname) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int FindSprite (const char *sprname)
{
	int i;
	DWORD nameint = *((DWORD *)sprname);

	for (i = 0; i < NumUnchangedSprites; ++i)
	{
		if (*((DWORD *)&UnchangedSpriteNames[i*4]) == nameint)
		{
			return i;
		}
	}
	return -1;
}